

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::InternalMetadata
          (InternalMetadata *this,Arena *arena,bool is_message_owned)

{
  LogMessage *other;
  Arena *local_80;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  undefined1 local_19;
  Arena *pAStack_18;
  bool is_message_owned_local;
  Arena *arena_local;
  InternalMetadata *this_local;
  
  local_80 = arena;
  if (is_message_owned) {
    local_80 = (Arena *)((ulong)arena | 2);
  }
  this->ptr_ = (intptr_t)local_80;
  local_59 = 0;
  local_19 = is_message_owned;
  pAStack_18 = arena;
  arena_local = (Arena *)this;
  if ((is_message_owned) && (arena == (Arena *)0x0)) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/metadata_lite.h"
               ,0x45);
    local_59 = 1;
    other = LogMessage::operator<<
                      (&local_58,"CHECK failed: !is_message_owned || arena != nullptr: ");
    LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena, bool is_message_owned = false)
      : ptr_(is_message_owned
                 ? reinterpret_cast<intptr_t>(arena) | kMessageOwnedArenaTagMask
                 : reinterpret_cast<intptr_t>(arena)) {
    GOOGLE_DCHECK(!is_message_owned || arena != nullptr);
  }